

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int tx_elements_input_issuance_proof_init
              (wally_tx_input *input,uchar *issuance_amount_rangeproof,
              size_t issuance_amount_rangeproof_len,uchar *inflation_keys_rangeproof,
              size_t inflation_keys_rangeproof_len)

{
  uchar *__dest;
  int iVar1;
  uchar *local_38;
  
  if ((issuance_amount_rangeproof != (uchar *)0x0) == (issuance_amount_rangeproof_len == 0)) {
    return -2;
  }
  if ((inflation_keys_rangeproof != (uchar *)0x0) == (inflation_keys_rangeproof_len == 0)) {
    return -2;
  }
  if (issuance_amount_rangeproof_len == 0) {
    local_38 = (uchar *)0x0;
LAB_001140af:
    iVar1 = 0;
    if (inflation_keys_rangeproof_len == 0) {
      __dest = (uchar *)0x0;
    }
    else {
      __dest = (uchar *)wally_malloc(inflation_keys_rangeproof_len);
      if (__dest == (uchar *)0x0) goto LAB_00114103;
      memcpy(__dest,inflation_keys_rangeproof,inflation_keys_rangeproof_len);
    }
    input->issuance_amount_rangeproof = local_38;
    input->issuance_amount_rangeproof_len = issuance_amount_rangeproof_len;
    input->inflation_keys_rangeproof = __dest;
    input->inflation_keys_rangeproof_len = inflation_keys_rangeproof_len;
  }
  else {
    local_38 = (uchar *)wally_malloc(issuance_amount_rangeproof_len);
    if (local_38 != (uchar *)0x0) {
      memcpy(local_38,issuance_amount_rangeproof,issuance_amount_rangeproof_len);
      goto LAB_001140af;
    }
    local_38 = (uchar *)0x0;
LAB_00114103:
    clear_and_free(local_38,issuance_amount_rangeproof_len);
    clear_and_free((void *)0x0,inflation_keys_rangeproof_len);
    iVar1 = -3;
  }
  return iVar1;
}

Assistant:

static int tx_elements_input_issuance_proof_init(
    struct wally_tx_input *input,
    const unsigned char *issuance_amount_rangeproof,
    size_t issuance_amount_rangeproof_len,
    const unsigned char *inflation_keys_rangeproof,
    size_t inflation_keys_rangeproof_len)
{
#ifdef BUILD_ELEMENTS
    unsigned char *new_issuance_amount_rangeproof = NULL, *new_inflation_keys_rangeproof = NULL;
#endif
    (void) input;

    if (BYTES_INVALID(issuance_amount_rangeproof, issuance_amount_rangeproof_len) ||
        BYTES_INVALID(inflation_keys_rangeproof, inflation_keys_rangeproof_len))
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if (!clone_bytes(&new_issuance_amount_rangeproof, issuance_amount_rangeproof, issuance_amount_rangeproof_len) ||
        !clone_bytes(&new_inflation_keys_rangeproof, inflation_keys_rangeproof, inflation_keys_rangeproof_len)) {
        clear_and_free(new_issuance_amount_rangeproof, issuance_amount_rangeproof_len);
        clear_and_free(new_inflation_keys_rangeproof, inflation_keys_rangeproof_len);
        return WALLY_ENOMEM;
    }

    input->issuance_amount_rangeproof = new_issuance_amount_rangeproof;
    input->issuance_amount_rangeproof_len = issuance_amount_rangeproof_len;
    input->inflation_keys_rangeproof = new_inflation_keys_rangeproof;
    input->inflation_keys_rangeproof_len = inflation_keys_rangeproof_len;
#endif
    return WALLY_OK;
}